

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

void __thiscall cfd::core::TapBranch::TapBranch(TapBranch *this,TapBranch *tap_tree)

{
  this->_vptr_TapBranch = (_func_int **)&PTR__TapBranch_006549a8;
  Script::Script(&this->script_);
  ByteData256::ByteData256(&this->root_commitment_);
  (this->branch_list_).
  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->branch_list_).
  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->branch_list_).
  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->has_leaf_ = tap_tree->has_leaf_;
  this->leaf_version_ = tap_tree->leaf_version_;
  Script::operator=(&this->script_,&tap_tree->script_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->root_commitment_,
             &(tap_tree->root_commitment_).data_);
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::operator=
            (&this->branch_list_,&tap_tree->branch_list_);
  return;
}

Assistant:

TapBranch::TapBranch(const TapBranch& tap_tree) {
  has_leaf_ = tap_tree.has_leaf_;
  leaf_version_ = tap_tree.leaf_version_;
  script_ = tap_tree.script_;
  root_commitment_ = tap_tree.root_commitment_;
  branch_list_ = tap_tree.branch_list_;
}